

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.h
# Opt level: O0

string * spvtools::utils::ToString<unsigned_int>(string *__return_storage_ptr__,uint val)

{
  stringstream local_1a0 [8];
  stringstream os;
  undefined1 auStack_190 [380];
  uint local_14;
  string *psStack_10;
  uint val_local;
  
  local_14 = val;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::operator<<(auStack_190,local_14);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(T val) {
  static_assert(
      std::is_arithmetic<T>::value,
      "spvtools::utils::ToString is restricted to only arithmetic values");
  std::stringstream os;
  os << val;
  return os.str();
}